

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

shared_ptr<minja::Expression> __thiscall minja::Parser::parseMathPlusMinus(Parser *this)

{
  int iVar1;
  long lVar2;
  runtime_error *prVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  shared_ptr<minja::Expression> sVar4;
  Op op;
  shared_ptr<minja::Expression> right;
  undefined1 local_80 [16];
  string op_str;
  string local_50;
  
  if (parseMathPlusMinus()::plus_minus_tok_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&parseMathPlusMinus()::plus_minus_tok_abi_cxx11_);
    if (iVar1 != 0) {
      httplib::detail::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
      basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                  &parseMathPlusMinus()::plus_minus_tok_abi_cxx11_,"\\+|-(?![}%#]\\})",0x10);
      __cxa_atexit(httplib::detail::std::__cxx11::
                   basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseMathPlusMinus()::plus_minus_tok_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseMathPlusMinus()::plus_minus_tok_abi_cxx11_);
    }
  }
  parseMathMulDiv(this);
  if ((this->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    op_str._M_dataplus._M_p = (pointer)&op_str.field_2;
    op_str._M_string_length = 0;
    op_str.field_2._M_local_buf[0] = '\0';
    while( true ) {
      consumeToken(&local_50,in_RSI,&parseMathPlusMinus()::plus_minus_tok_abi_cxx11_,Strip);
      lVar2 = std::__cxx11::string::operator=((string *)&op_str,(string *)&local_50);
      lVar2 = *(long *)(lVar2 + 8);
      std::__cxx11::string::~string((string *)&local_50);
      if (lVar2 == 0) {
        std::__cxx11::string::~string((string *)&op_str);
        sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             extraout_RDX._M_pi;
        sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this;
        return (shared_ptr<minja::Expression>)
               sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
      }
      parseMathMulDiv((Parser *)&right);
      if (right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) break;
      std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&op_str,
                      "+");
      get_location((Location *)&local_50,in_RSI);
      std::
      make_shared<minja::BinaryOpExpr,minja::Location,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,minja::BinaryOpExpr::Op&>
                ((Location *)local_80,(shared_ptr<minja::Expression> *)&local_50,
                 (shared_ptr<minja::Expression> *)this,(Op *)&right);
      std::__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<minja::BinaryOpExpr,_(__gnu_cxx::_Lock_policy)2> *)local_80);
      httplib::detail::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
      httplib::detail::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
      httplib::detail::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar3,"Expected right side of \'math plus/minus\' expression");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"Expected left side of \'math plus/minus\' expression");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Expression> parseMathPlusMinus() {
        static std::regex plus_minus_tok(R"(\+|-(?![}%#]\}))");

        auto left = parseMathMulDiv();
        if (!left) throw std::runtime_error("Expected left side of 'math plus/minus' expression");
        std::string op_str;
        while (!(op_str = consumeToken(plus_minus_tok)).empty()) {
            auto right = parseMathMulDiv();
            if (!right) throw std::runtime_error("Expected right side of 'math plus/minus' expression");
            auto op = op_str == "+" ? BinaryOpExpr::Op::Add : BinaryOpExpr::Op::Sub;
            left = std::make_shared<BinaryOpExpr>(get_location(), std::move(left), std::move(right), op);
        }
        return left;
    }